

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.h
# Opt level: O1

int __thiscall CVmObjFrameRef::get_var_frame_index(CVmObjFrameRef *this,CVmDbgFrameSymPtr *symp)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = *(ushort *)symp->p_;
  uVar2 = (uint)uVar1;
  if ((*(ushort *)((long)symp->p_ + 2) & 1) != 0) {
    uVar2 = (uint)uVar1 + *(int *)((this->super_CVmObject).ext_ + 0x20);
  }
  return uVar2;
}

Assistant:

uint get_flags() const { return osrp2(p_ + 2); }